

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::UnicodeString::doReplace
          (UnicodeString *this,int32_t start,int32_t length,UnicodeString *src,int32_t srcStart,
          int32_t srcLength)

{
  short sVar1;
  UnicodeString *pUVar2;
  int32_t srcStart_00;
  int32_t iVar3;
  int srcLength_00;
  
  sVar1 = (src->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (src->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  srcStart_00 = srcStart;
  if (iVar3 < srcStart) {
    srcStart_00 = iVar3;
  }
  if (srcStart < 0) {
    srcStart_00 = 0;
  }
  srcLength_00 = iVar3 - srcStart_00;
  if (srcLength <= iVar3 - srcStart_00) {
    srcLength_00 = srcLength;
  }
  if (srcLength < 0) {
    srcLength_00 = 0;
  }
  if (((int)sVar1 & 2U) == 0) {
    pUVar2 = doReplace(this,start,length,(src->fUnion).fFields.fArray,srcStart_00,srcLength_00);
    return pUVar2;
  }
  pUVar2 = doReplace(this,start,length,(src->fUnion).fStackFields.fBuffer,srcStart_00,srcLength_00);
  return pUVar2;
}

Assistant:

UnicodeString&
UnicodeString::doReplace( int32_t start,
              int32_t length,
              const UnicodeString& src,
              int32_t srcStart,
              int32_t srcLength)
{
  // pin the indices to legal values
  src.pinIndices(srcStart, srcLength);

  // get the characters from src
  // and replace the range in ourselves with them
  return doReplace(start, length, src.getArrayStart(), srcStart, srcLength);
}